

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_rva.inc.c
# Opt level: O3

_Bool gen_amo(DisasContext_conflict12 *ctx,arg_atomic *a,
             _func_void_TCGContext_ptr_TCGv_i64_TCGv_i64_TCGv_i64_TCGArg_MemOp *func,MemOp mop)

{
  TCGContext_conflict11 *s;
  undefined1 extraout_AL;
  TCGTemp *a1;
  TCGTemp *a1_00;
  TCGv_i64 pTVar1;
  TCGv_i64 a2;
  TCGOpcode TVar2;
  uintptr_t o_4;
  uintptr_t o_3;
  TCGv_i64 pTVar3;
  
  s = ctx->uc->tcg_ctx;
  a1 = tcg_temp_new_internal_riscv64(s,TCG_TYPE_I64,false);
  pTVar3 = (TCGv_i64)((long)a1 - (long)s);
  a1_00 = tcg_temp_new_internal_riscv64(s,TCG_TYPE_I64,false);
  if ((long)a->rs1 == 0) {
    TVar2 = INDEX_op_movi_i64;
    pTVar1 = (TCGv_i64)0x0;
LAB_00c72326:
    tcg_gen_op2_riscv64(s,TVar2,(TCGArg)a1,(TCGArg)pTVar1);
  }
  else if (s->cpu_gpr[a->rs1] != pTVar3) {
    pTVar1 = s->cpu_gpr[a->rs1] + (long)s;
    TVar2 = INDEX_op_mov_i64;
    goto LAB_00c72326;
  }
  pTVar1 = (TCGv_i64)((long)a1_00 - (long)s);
  if ((long)a->rs2 == 0) {
    TVar2 = INDEX_op_movi_i64;
    a2 = (TCGv_i64)0x0;
  }
  else {
    if (s->cpu_gpr[a->rs2] == pTVar1) goto LAB_00c72369;
    a2 = s->cpu_gpr[a->rs2] + (long)s;
    TVar2 = INDEX_op_mov_i64;
  }
  tcg_gen_op2_riscv64(s,TVar2,(TCGArg)a1_00,(TCGArg)a2);
LAB_00c72369:
  (*func)(s,pTVar1,pTVar3,pTVar1,(TCGArg)ctx->mem_idx,mop);
  if (((long)a->rd != 0) && (s->cpu_gpr[a->rd] != pTVar1)) {
    tcg_gen_op2_riscv64(s,INDEX_op_mov_i64,(TCGArg)(s->cpu_gpr[a->rd] + (long)s),(TCGArg)a1_00);
  }
  tcg_temp_free_internal_riscv64(s,(TCGTemp *)(pTVar3 + (long)s));
  tcg_temp_free_internal_riscv64(s,(TCGTemp *)(pTVar1 + (long)s));
  return (_Bool)extraout_AL;
}

Assistant:

static bool gen_amo(DisasContext *ctx, arg_atomic *a,
                    void(*func)(TCGContext *, TCGv, TCGv, TCGv, TCGArg, MemOp),
                    MemOp mop)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv src1 = tcg_temp_new(tcg_ctx);
    TCGv src2 = tcg_temp_new(tcg_ctx);

    gen_get_gpr(tcg_ctx, src1, a->rs1);
    gen_get_gpr(tcg_ctx, src2, a->rs2);

    (*func)(tcg_ctx, src2, src1, src2, ctx->mem_idx, mop);

    gen_set_gpr(tcg_ctx, a->rd, src2);
    tcg_temp_free(tcg_ctx, src1);
    tcg_temp_free(tcg_ctx, src2);
    return true;
}